

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol_exception.cc
# Opt level: O2

void __thiscall rcdiscover::WOLException::WOLException(WOLException *this,string *msg,int errnum)

{
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)msg);
  *(undefined ***)this = &PTR__WOLException_00113c40;
  this->errnum_ = errnum;
  std::operator+(&local_38,msg," - ");
  std::__cxx11::to_string(&sStack_58,errnum);
  std::operator+(&this->msg_,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

WOLException::WOLException(const std::string& msg, const int errnum) :
  std::runtime_error(msg),
  errnum_(errnum),
  msg_(msg + " - " + std::to_string(errnum))
{ }